

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::notifyDragStarted(QApplicationPrivate *this,QDrag *drag)

{
  bool bVar1;
  QObject *in_RSI;
  QDrag *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  QGuiApplicationPrivate::notifyDragStarted(in_RDI);
  if (qt_button_down != (QWidget *)0x0) {
    bVar1 = QObject::inherits(in_RSI,in_stack_ffffffffffffffe8);
    if (!bVar1) {
      qt_button_down = (QWidget *)0x0;
    }
  }
  return;
}

Assistant:

void QApplicationPrivate::notifyDragStarted(const QDrag *drag)
{
    QGuiApplicationPrivate::notifyDragStarted(drag);
    // QTBUG-26145
    // Prevent pickMouseReceiver() from using the widget where the drag was started after a drag operation...
    // QTBUG-56713
    // ...only if qt_button_down is not a QQuickWidget
    if (qt_button_down && !qt_button_down->inherits("QQuickWidget"))
        qt_button_down = nullptr;
}